

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

bool __thiscall
irr::video::COpenGL3DriverBase::setClipPlane
          (COpenGL3DriverBase *this,u32 index,plane3df *plane,bool enable)

{
  pointer *ppSVar1;
  iterator __position;
  undefined8 uVar2;
  pointer pSVar3;
  SUserClipPlane local_48;
  
  pSVar3 = (this->UserClipPlane).m_data.
           super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->UserClipPlane).m_data.
       super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((uint)((int)((ulong)((long)__position._M_current - (long)pSVar3) >> 2) * -0x33333333) <= index
     ) {
    local_48.Enabled = false;
    local_48._17_3_ = 0;
    local_48.Plane.Normal.X = 0.0;
    local_48.Plane.Normal.Y = 1.0;
    local_48.Plane.Normal.Z = 0.0;
    local_48.Plane.D = -0.0;
    if (__position._M_current ==
        (this->UserClipPlane).m_data.
        super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
      ::_M_realloc_insert<irr::video::COpenGL3DriverBase::SUserClipPlane>
                (&(this->UserClipPlane).m_data,__position,&local_48);
    }
    else {
      *(undefined4 *)&(__position._M_current)->Enabled = 0;
      ((__position._M_current)->Plane).Normal.X = 0.0;
      ((__position._M_current)->Plane).Normal.Y = 1.0;
      *(undefined8 *)&((__position._M_current)->Plane).Normal.Z = 0x8000000000000000;
      ppSVar1 = &(this->UserClipPlane).m_data.
                 super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    (this->UserClipPlane).is_sorted = false;
    pSVar3 = (this->UserClipPlane).m_data.
             super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar2 = *(undefined8 *)&(plane->Normal).Z;
  *(undefined8 *)&pSVar3[index].Plane.Normal = *(undefined8 *)&plane->Normal;
  *(undefined8 *)((long)&pSVar3[index].Plane.Normal + 8) = uVar2;
  (this->UserClipPlane).m_data.
  super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
  ._M_impl.super__Vector_impl_data._M_start[index].Enabled = enable;
  return true;
}

Assistant:

bool COpenGL3DriverBase::setClipPlane(u32 index, const core::plane3df &plane, bool enable)
{
	if (index >= UserClipPlane.size())
		UserClipPlane.push_back(SUserClipPlane());

	UserClipPlane[index].Plane = plane;
	UserClipPlane[index].Enabled = enable;
	return true;
}